

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O0

bool __thiscall
HighsTimer::reportOnTolerance
          (HighsTimer *this,char *grep_stamp,vector<int,_std::allocator<int>_> *clock_list,
          double ideal_sum_time,double tolerance_percent_report)

{
  allocator_type *paVar1;
  value_type vVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint *puVar6;
  reference pvVar7;
  undefined8 uVar8;
  reference pvVar9;
  double *pdVar10;
  undefined8 uVar11;
  size_t in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  void *__buf;
  undefined8 in_RSI;
  HighsTimer *in_RDI;
  double in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  double dVar12;
  double in_XMM1_Qa;
  double percent_ideal_1;
  double percent_run_highs;
  double percent_sum_clock_times_all;
  double percent_ideal;
  bool report_time;
  double time_per_call;
  double percent_run_highs_1;
  double time;
  HighsInt iClock_2;
  size_t i_2;
  double sum_time;
  HighsInt iClock_1;
  size_t i_1;
  double max_percent_sum_clock_times;
  vector<double,_std::allocator<double>_> percent_sum_clock_times;
  bool clock_stopped;
  HighsInt iClock;
  size_t i;
  double sum_clock_times;
  HighsInt sum_calls;
  bool non_null_report;
  double current_run_highs_time;
  size_t num_clock_list_entries;
  allocator_type *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  vector<double,_std::allocator<double>_> *this_00;
  size_type local_b8;
  double local_b0;
  size_type local_a0;
  double local_98 [4];
  vector<double,_std::allocator<double>_> local_78;
  undefined1 local_5d;
  uint local_5c;
  ulong local_58;
  double local_50;
  int local_48;
  byte local_41;
  undefined8 local_40;
  size_type local_38;
  double local_30;
  double local_28;
  vector<int,_std::allocator<int>_> *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_30 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_38 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  read(in_RDI,0,__buf,in_RCX);
  local_41 = 0;
  local_48 = 0;
  local_50 = 0.0;
  local_40 = extraout_XMM0_Qa;
  for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_20,local_58);
    local_5c = *puVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->clock_start,(long)(int)local_5c);
    uVar5 = local_5c;
    local_5d = 0.0 < *pvVar7;
    if (!(bool)local_5d) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&in_RDI->clock_names,(long)(int)local_5c);
      uVar8 = std::__cxx11::string::c_str();
      printf("Clock %d - %s - still running\n",(ulong)uVar5,uVar8);
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->clock_num_call,(long)(int)local_5c);
    local_48 = *pvVar9 + local_48;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->clock_time,(long)(int)local_5c);
    local_50 = *pvVar7 + local_50;
  }
  if (local_48 == 0) {
    local_1 = local_41 & 1;
  }
  else if (0.0 <= local_50) {
    std::allocator<double>::allocator((allocator<double> *)0x611cf8);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::allocator<double>::~allocator((allocator<double> *)0x611d1e);
    local_98[0] = 0.0;
    for (local_a0 = 0; local_a0 < local_38; local_a0 = local_a0 + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_a0);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->clock_time,(long)*pvVar9);
      dVar12 = (*pvVar7 * 100.0) / local_50;
      this_00 = &local_78;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_a0);
      *pvVar7 = dVar12;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_a0);
      pdVar10 = std::max<double>(pvVar7,local_98);
      local_98[0] = *pdVar10;
    }
    if (local_30 <= local_98[0]) {
      local_41 = 1;
      printf("\n%s-time  Operation                       :    Time     ( Total",local_18);
      if (0.0 < local_28) {
        printf(";  Ideal");
      }
      printf(";  Local):    Calls  Time/Call\n");
      local_b0 = 0.0;
      for (local_b8 = 0; local_b8 < local_38; local_b8 = local_b8 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_b8);
        iVar3 = *pvVar9;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->clock_time,(long)iVar3);
        paVar1 = (allocator_type *)*pvVar7;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->clock_num_call,(long)iVar3);
        if (0 < *pvVar9) {
          in_stack_fffffffffffffec0 = paVar1;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->clock_num_call,(long)iVar3);
          dVar12 = (double)in_stack_fffffffffffffec0 / (double)*pvVar9;
          if (local_30 <= 0.0) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->clock_num_call,(long)iVar3);
            bVar4 = 0 < *pvVar9;
          }
          else {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_b8);
            bVar4 = local_30 <= *pvVar7;
          }
          uVar8 = local_18;
          if (bVar4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&in_RDI->clock_names,(long)iVar3);
            uVar11 = std::__cxx11::string::c_str();
            printf("%s-time  %-32s: %11.4e (%5.1f%%",paVar1,uVar8,uVar11);
            if (0.0 < local_28) {
              printf("; %5.1f%%",((double)paVar1 * 100.0) / local_28);
            }
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_b8);
            vVar2 = *pvVar7;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->clock_num_call,(long)iVar3);
            printf("; %5.1f%%):%9ld %11.4e\n",vVar2,dVar12,(long)*pvVar9);
          }
        }
        local_b0 = (double)paVar1 + local_b0;
      }
      printf("%s-time  SUM                             : %11.4e (%5.1f%%",local_b0,local_18);
      if (0.0 < local_28) {
        printf("; %5.1f%%",(local_b0 * 100.0) / local_28);
      }
      printf("; %5.1f%%)\n",0x4059000000000000);
      printf("%s-time  TOTAL                           : %11.4e\n",local_40,local_18);
    }
    local_1 = local_41 & 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0);
  }
  else {
    local_1 = local_41 & 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool reportOnTolerance(
      const char*
          grep_stamp,  //!< Character string used to extract output using grep
      std::vector<HighsInt>& clock_list,  //!< List of indices to report
      double ideal_sum_time = 0,          //!< Ideal value for times to sum to
      double tolerance_percent_report =
          0  //!< Lower bound on percentage of total time
             //!< before an individual clock is reported
  ) {
    size_t num_clock_list_entries = clock_list.size();
    double current_run_highs_time = read();
    bool non_null_report = false;

    // Check validity of the clock list and check no clocks are still
    // running, determine whether there are any times to report and
    // determine the total clock times
    HighsInt sum_calls = 0;
    double sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      assert(iClock >= 0);
      assert(iClock < num_clock);
      // Check that the clock's not still running. It should be set to
      // getWallTime() >= 0 (or initialised to initial_clock_start > 0)
      const bool clock_stopped = clock_start[iClock] > 0;
      if (!clock_stopped) {
        printf("Clock %d - %s - still running\n", int(iClock),
               clock_names[iClock].c_str());
      }
      assert(clock_stopped);
      sum_calls += clock_num_call[iClock];
      sum_clock_times += clock_time[iClock];
    }
    if (!sum_calls) return non_null_report;
    if (sum_clock_times < 0) return non_null_report;

    std::vector<double> percent_sum_clock_times(num_clock_list_entries);
    double max_percent_sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      percent_sum_clock_times[i] = 100.0 * clock_time[iClock] / sum_clock_times;
      max_percent_sum_clock_times =
          std::max(percent_sum_clock_times[i], max_percent_sum_clock_times);
    }
    if (max_percent_sum_clock_times < tolerance_percent_report)
      return non_null_report;

    non_null_report = true;

    // Report one line per clock, the time, number of calls and time per call
    printf("\n%s-time  Operation                       :    Time     ( Total",
           grep_stamp);
    if (ideal_sum_time > 0) printf(";  Ideal");
    printf(";  Local):    Calls  Time/Call\n");
    // Convert approximate seconds
    double sum_time = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      double time = clock_time[iClock];
      double percent_run_highs = 100.0 * time / current_run_highs_time;
      double time_per_call = 0;
      if (clock_num_call[iClock] > 0) {
        time_per_call = time / clock_num_call[iClock];
        const bool report_time =
            tolerance_percent_report > 0
                ? percent_sum_clock_times[i] >= tolerance_percent_report
                : clock_num_call[iClock] > 0;
        if (report_time) {
          printf("%s-time  %-32s: %11.4e (%5.1f%%", grep_stamp,
                 clock_names[iClock].c_str(), time, percent_run_highs);
          if (ideal_sum_time > 0) {
            double percent_ideal = 100.0 * time / ideal_sum_time;
            printf("; %5.1f%%", percent_ideal);
          }
          printf("; %5.1f%%):%9ld %11.4e\n", percent_sum_clock_times[i],
                 static_cast<long int>(clock_num_call[iClock]), time_per_call);
        }
      }
      sum_time += time;
    }
    double percent_sum_clock_times_all = 100.0;
    assert(sum_time == sum_clock_times);
    double percent_run_highs = 100.0 * sum_time / current_run_highs_time;
    printf("%s-time  SUM                             : %11.4e (%5.1f%%",
           grep_stamp, sum_time, percent_run_highs);
    if (ideal_sum_time > 0) {
      double percent_ideal = 100.0 * sum_time / ideal_sum_time;
      printf("; %5.1f%%", percent_ideal);
    }
    printf("; %5.1f%%)\n", percent_sum_clock_times_all);
    printf("%s-time  TOTAL                           : %11.4e\n", grep_stamp,
           current_run_highs_time);
    return non_null_report;
  }